

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void jsondec_wellknown(jsondec *d,upb_Message *msg,upb_MessageDef *m)

{
  upb_Map *puVar1;
  char *pcVar2;
  byte bVar3;
  upb_MessageValue val;
  bool bVar4;
  _Bool _Var5;
  upb_WellKnown uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  upb_EncodeStatus uVar12;
  int iVar13;
  upb_FieldDef *puVar14;
  char *pcVar15;
  upb_MessageDef *puVar16;
  upb_MiniTable *puVar17;
  upb_Message *puVar18;
  upb_MutableMessageValue arr;
  char *pcVar19;
  undefined8 uVar20;
  ulong __n;
  char *pcVar21;
  ulong size;
  char *pcVar22;
  upb_Arena *puVar23;
  char *pcVar24;
  upb_Map *end;
  long lVar25;
  bool bVar26;
  upb_StringView uVar27;
  upb_MessageValue uVar28;
  upb_MessageValue val_00;
  upb_MessageValue seconds;
  char *ptr;
  _Bool local_81;
  upb_Message *local_80;
  char *local_78;
  upb_FieldDef *local_70;
  upb_MessageValue local_68;
  char local_58;
  upb_MessageDef *local_50;
  upb_FieldDef *local_48;
  char *local_40;
  char *local_38;
  
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x5d6,"void jsondec_wellknown(jsondec *, upb_Message *, const upb_MessageDef *)")
    ;
  }
  uVar6 = upb_MessageDef_WellKnownType(m);
  local_80 = msg;
  switch(uVar6) {
  case kUpb_WellKnown_Any:
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x588,"void jsondec_any(jsondec *, upb_Message *, const upb_MessageDef *)");
    }
    local_50 = m;
    local_48 = upb_MessageDef_FindFieldByNumber(m,2);
    jsondec_objstart(d);
    pcVar24 = (char *)0x0;
    pcVar22 = (char *)0x0;
    do {
      _Var5 = jsondec_objnext(d);
      if (!_Var5) {
        pcVar22 = "Any object didn\'t contain a \'@type\' field";
        goto LAB_002fe07c;
      }
      pcVar19 = d->ptr;
      uVar27 = jsondec_string(d);
      jsondec_skipws(d);
      jsondec_parselit(d,":");
      _Var5 = jsondec_streql(uVar27,"@type");
      puVar18 = local_80;
      if (_Var5) {
        local_78 = pcVar24;
        local_40 = pcVar19;
        if (((ulong)local_80->field_0 & 1) != 0) {
          __assert_fail("!upb_Message_IsFrozen(msg)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                        ,0x56a,
                        "const upb_MessageDef *jsondec_typeurl(jsondec *, upb_Message *, const upb_MessageDef *)"
                       );
        }
        local_70 = upb_MessageDef_FindFieldByNumber(local_50,1);
        uVar28.str_val = jsondec_string(d);
        pcVar15 = uVar28.str_val.data;
        pcVar24 = pcVar15 + uVar28.str_val.size;
        upb_Message_SetFieldByDef(puVar18,local_70,uVar28,d->arena);
        pcVar19 = pcVar24;
        do {
          pcVar21 = pcVar19;
          if (pcVar19 <= pcVar15) break;
          pcVar21 = pcVar19 + -1;
          pcVar2 = pcVar19 + -1;
          pcVar19 = pcVar21;
        } while (*pcVar2 != '/');
        if ((pcVar21 == pcVar15) || (pcVar21 == pcVar24)) {
          jsondec_err(d,"Type url must have at least one \'/\' and non-empty host");
        }
        puVar16 = upb_DefPool_FindMessageByNameWithSize
                            (d->symtab,pcVar21 + 1,(long)pcVar24 - (long)(pcVar21 + 1));
        if (puVar16 == (upb_MessageDef *)0x0) {
          pcVar22 = "Type was not found";
          goto LAB_002fe07c;
        }
        if (local_78 == (char *)0x0) {
          pcVar24 = (char *)0x0;
        }
        else {
          pcVar22 = local_40 + 1;
          do {
            pcVar19 = pcVar22 + -1;
            pcVar22 = pcVar22 + -1;
            pcVar24 = local_78;
          } while (*pcVar19 != ',');
        }
      }
      else {
        if (pcVar24 == (char *)0x0) {
          pcVar24 = pcVar19;
        }
        jsondec_skipval(d);
        puVar16 = (upb_MessageDef *)0x0;
      }
    } while (puVar16 == (upb_MessageDef *)0x0);
    puVar17 = upb_MessageDef_MiniTable(puVar16);
    puVar18 = upb_Message_New(puVar17,d->arena);
    if (pcVar24 != (char *)0x0) {
      __n = (long)pcVar22 - (long)pcVar24;
      puVar23 = d->arena;
      size = (__n & 0xfffffffffffffff8) + 8;
      pcVar22 = puVar23->ptr_dont_copy_me__upb_internal_use_only;
      if ((ulong)((long)puVar23->end_dont_copy_me__upb_internal_use_only - (long)pcVar22) < size) {
        pcVar22 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar23,size);
      }
      else {
        if ((char *)((ulong)(pcVar22 + 7) & 0xfffffffffffffff8) != pcVar22) {
          __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                        ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
        }
        puVar23->ptr_dont_copy_me__upb_internal_use_only = pcVar22 + size;
      }
      local_70 = (upb_FieldDef *)d->ptr;
      local_78 = d->end;
      memcpy(pcVar22,pcVar24,__n);
      pcVar22[__n] = '}';
      d->ptr = pcVar22;
      d->end = pcVar22 + __n + 1;
      d->is_first = true;
      while (_Var5 = jsondec_objnext(d), _Var5) {
        jsondec_anyfield(d,puVar18,puVar16);
      }
      d->ptr = (char *)local_70;
      d->end = local_78;
    }
    while (_Var5 = jsondec_objnext(d), _Var5) {
      jsondec_anyfield(d,puVar18,puVar16);
    }
    d->depth = d->depth + 1;
    jsondec_wsch(d,'}');
    puVar17 = upb_MessageDef_MiniTable(puVar16);
    uVar12 = upb_Encode(puVar18,puVar17,0,d->arena,(char **)&local_68.array_val,
                        &local_68.str_val.size);
    if (uVar12 != kUpb_EncodeStatus_Ok) {
      __assert_fail("status == kUpb_EncodeStatus_Ok",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x5c7,"void jsondec_any(jsondec *, upb_Message *, const upb_MessageDef *)");
    }
    puVar23 = d->arena;
    uVar20 = local_68.double_val;
    puVar14 = local_48;
    msg = local_80;
    break;
  case kUpb_WellKnown_FieldMask:
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x53f,
                    "void jsondec_fieldmask(jsondec *, upb_Message *, const upb_MessageDef *)");
    }
    puVar14 = upb_MessageDef_FindFieldByNumber(m,1);
    arr = upb_Message_Mutable(msg,puVar14,d->arena);
    uVar27 = jsondec_string(d);
    pcVar22 = uVar27.data;
    if ((long)uVar27.size < 1) {
      return;
    }
    pcVar24 = pcVar22 + uVar27.size;
    do {
      pcVar19 = (char *)memchr(pcVar22,0x2c,(long)pcVar24 - (long)pcVar22);
      if (pcVar19 == (char *)0x0) {
        uVar28.str_val = jsondec_mask(d,pcVar22,pcVar24);
        pcVar22 = pcVar24;
      }
      else {
        uVar28.str_val = jsondec_mask(d,pcVar22,pcVar19);
        pcVar22 = pcVar19 + 1;
      }
      upb_Array_Append(arr.array,uVar28,d->arena);
    } while (pcVar22 < pcVar24);
    return;
  case kUpb_WellKnown_Duration:
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x49b,"void jsondec_duration(jsondec *, upb_Message *, const upb_MessageDef *)"
                   );
    }
    uVar27 = jsondec_string(d);
    local_38 = uVar27.data;
    pcVar24 = local_38 + uVar27.size;
    local_81 = false;
    pcVar22 = upb_BufToInt64(local_38,pcVar24,&local_68.int64_val,&local_81);
    if (pcVar22 == (char *)0x0) {
      pcVar22 = "Integer overflow";
      goto LAB_002fe07c;
    }
    local_38 = pcVar22;
    uVar7 = jsondec_nanos(d,&local_38,pcVar24);
    if (((long)pcVar24 - (long)local_38 != 1) || (*local_38 != 's')) {
      pcVar22 = "Malformed duration";
      goto LAB_002fe07c;
    }
    if ((char *)(local_68.int64_val - 0x4979cb9e01U) < (char *)0xffffff6d0c68c3ff) {
      pcVar22 = "Duration out of range";
      goto LAB_002fe07c;
    }
    uVar9 = -uVar7;
    if (local_81 == false) {
      uVar9 = uVar7;
    }
    puVar14 = upb_MessageDef_FindFieldByNumber(m,1);
    val.str_val.size = local_68.str_val.size;
    val.int64_val = local_68.int64_val;
    upb_Message_SetFieldByDef(msg,puVar14,val,d->arena);
    puVar14 = upb_MessageDef_FindFieldByNumber(m,2);
    puVar23 = d->arena;
LAB_002fe00d:
    uVar20 = (upb_Map *)(ulong)uVar9;
    break;
  case kUpb_WellKnown_Timestamp:
    if (((ulong)msg->field_0 & 1) != 0) {
      local_50 = m;
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x459,
                    "void jsondec_timestamp(jsondec *, upb_Message *, const upb_MessageDef *)");
    }
    local_50 = m;
    uVar27 = jsondec_string(d);
    local_68.int64_val = (int64_t)uVar27.data;
    if (0x13 < uVar27.size) {
      end = (upb_Map *)(&(local_68.map_val)->key_size + uVar27.size);
      iVar8 = jsondec_tsdigits(d,(char **)&local_68.array_val,4,"-");
      uVar9 = jsondec_tsdigits(d,(char **)&local_68.array_val,2,"-");
      iVar13 = uVar9 + 9;
      if (2 < uVar9) {
        iVar13 = uVar9 - 3;
      }
      iVar10 = jsondec_tsdigits(d,(char **)&local_68.array_val,2,"T");
      iVar11 = jsondec_tsdigits(d,(char **)&local_68.array_val,2,":");
      local_70 = (upb_FieldDef *)CONCAT44(local_70._4_4_,iVar11);
      iVar11 = jsondec_tsdigits(d,(char **)&local_68.array_val,2,":");
      local_78 = (char *)CONCAT44(local_78._4_4_,iVar11);
      iVar11 = jsondec_tsdigits(d,(char **)&local_68.array_val,2,(char *)0x0);
      uVar9 = (iVar8 - (uint)(uVar9 < 3)) + 0x12c0;
      lVar25 = (long)iVar11 + (long)((int)local_78 * 0x3c) + (long)((int)local_70 * 0xe10) +
               (long)(int)((iVar13 * 0xf4ff + 0x301U >> 0xb) +
                           uVar9 / 400 + (uVar9 >> 2) + (iVar10 - uVar9 / 100) + uVar9 * 0x16d +
                          -0x25bab9) * 0x15180;
      uVar9 = jsondec_nanos(d,(char **)&local_68.array_val,(char *)end);
      uVar20 = local_68.double_val;
      if (local_68._0_8_ == end) {
LAB_002fdfad:
        bVar26 = false;
      }
      else {
        puVar1 = (upb_Map *)
                 ((long)&(local_68.array_val)->data_dont_copy_me__upb_internal_use_only + 1);
        bVar3 = (local_68.map_val)->key_size;
        uVar20 = ZEXT18(bVar3);
        bVar4 = false;
        bVar26 = false;
        local_68.array_val = (upb_Array *)puVar1;
        if (bVar3 == 0x2b) {
LAB_002fdf4c:
          if ((long)end - (long)puVar1 != 5) goto LAB_002fdfad;
          iVar13 = jsondec_tsdigits(d,(char **)&local_68.array_val,2,":");
          iVar8 = jsondec_tsdigits(d,(char **)&local_68.array_val,2,(char *)0x0);
          iVar8 = iVar13 * 0x3c + iVar8;
          uVar7 = iVar8 * -0x3c;
          if (bVar4) {
            uVar7 = iVar8 * 0x3c;
          }
          uVar20 = ZEXT48(uVar7);
          lVar25 = lVar25 + (int)uVar7;
          bVar26 = true;
        }
        else if (bVar3 == 0x5a) {
          bVar26 = puVar1 == end;
        }
        else if (bVar3 == 0x2d) {
          bVar4 = true;
          goto LAB_002fdf4c;
        }
      }
      puVar16 = local_50;
      msg = local_80;
      if (bVar26) {
        if (lVar25 < -0xe7791f700) {
          pcVar22 = "Timestamp out of range";
          goto LAB_002fe07c;
        }
        puVar14 = upb_MessageDef_FindFieldByNumber(local_50,1);
        uVar28.str_val.size = uVar20;
        uVar28.array_val = (upb_Array *)lVar25;
        upb_Message_SetFieldByDef(msg,puVar14,uVar28,d->arena);
        puVar14 = upb_MessageDef_FindFieldByNumber(puVar16,2);
        puVar23 = d->arena;
        local_68.str_val.size = uVar20;
        goto LAB_002fe00d;
      }
    }
    pcVar22 = "Malformed timestamp";
LAB_002fe07c:
    jsondec_err(d,pcVar22);
  case kUpb_WellKnown_DoubleValue:
  case kUpb_WellKnown_FloatValue:
  case kUpb_WellKnown_Int64Value:
  case kUpb_WellKnown_UInt64Value:
  case kUpb_WellKnown_Int32Value:
  case kUpb_WellKnown_UInt32Value:
  case kUpb_WellKnown_StringValue:
  case kUpb_WellKnown_BytesValue:
  case kUpb_WellKnown_BoolValue:
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x5cd,"void jsondec_wrapper(jsondec *, upb_Message *, const upb_MessageDef *)")
      ;
    }
    puVar14 = upb_MessageDef_FindFieldByNumber(m,1);
    jsondec_value((upb_JsonMessageValue *)&local_68.str_val,d,puVar14);
    if (local_58 != '\0') {
      __assert_fail("val.ignore == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x5d0,"void jsondec_wrapper(jsondec *, upb_Message *, const upb_MessageDef *)")
      ;
    }
    puVar23 = d->arena;
    uVar20 = local_68.int64_val;
    break;
  case kUpb_WellKnown_Value:
    jsondec_wellknownvalue(d,msg,m);
    return;
  case kUpb_WellKnown_ListValue:
    jsondec_listvalue(d,msg,m);
    return;
  case kUpb_WellKnown_Struct:
    jsondec_struct(d,msg,m);
    return;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x5f9,"void jsondec_wellknown(jsondec *, upb_Message *, const upb_MessageDef *)")
    ;
  }
  val_00.str_val.size = local_68.str_val.size;
  val_00.double_val = (double)uVar20;
  upb_Message_SetFieldByDef(msg,puVar14,val_00,puVar23);
  return;
}

Assistant:

static void jsondec_wellknown(jsondec* d, upb_Message* msg,
                              const upb_MessageDef* m) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  switch (upb_MessageDef_WellKnownType(m)) {
    case kUpb_WellKnown_Any:
      jsondec_any(d, msg, m);
      break;
    case kUpb_WellKnown_FieldMask:
      jsondec_fieldmask(d, msg, m);
      break;
    case kUpb_WellKnown_Duration:
      jsondec_duration(d, msg, m);
      break;
    case kUpb_WellKnown_Timestamp:
      jsondec_timestamp(d, msg, m);
      break;
    case kUpb_WellKnown_Value:
      jsondec_wellknownvalue(d, msg, m);
      break;
    case kUpb_WellKnown_ListValue:
      jsondec_listvalue(d, msg, m);
      break;
    case kUpb_WellKnown_Struct:
      jsondec_struct(d, msg, m);
      break;
    case kUpb_WellKnown_DoubleValue:
    case kUpb_WellKnown_FloatValue:
    case kUpb_WellKnown_Int64Value:
    case kUpb_WellKnown_UInt64Value:
    case kUpb_WellKnown_Int32Value:
    case kUpb_WellKnown_UInt32Value:
    case kUpb_WellKnown_StringValue:
    case kUpb_WellKnown_BytesValue:
    case kUpb_WellKnown_BoolValue:
      jsondec_wrapper(d, msg, m);
      break;
    default:
      UPB_UNREACHABLE();
  }
}